

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

bool __thiscall Catch::WildcardPattern::matches(WildcardPattern *this,string *str)

{
  bool bVar1;
  string sStack_58;
  ReusableStringStream local_38;
  SourceLineInfo local_28;
  
  switch(this->m_wildcard) {
  case NoWildcard:
    normaliseString(&sStack_58,this,str);
    bVar1 = std::operator==(&this->m_pattern,&sStack_58);
    break;
  case WildcardAtStart:
    normaliseString(&sStack_58,this,str);
    bVar1 = endsWith(&sStack_58,&this->m_pattern);
    break;
  case WildcardAtEnd:
    normaliseString(&sStack_58,this,str);
    bVar1 = startsWith(&sStack_58,&this->m_pattern);
    break;
  case WildcardAtBothEnds:
    normaliseString(&sStack_58,this,str);
    bVar1 = contains(&sStack_58,&this->m_pattern);
    break;
  default:
    ReusableStringStream::ReusableStringStream(&local_38);
    local_28.file =
         "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/catch_amalgamated.cpp"
    ;
    local_28.line = 0x1bd3;
    Catch::operator<<(local_38.m_oss,&local_28);
    std::operator<<(local_38.m_oss,": Internal Catch2 error: ");
    std::operator<<(local_38.m_oss,"Unknown enum");
    std::__cxx11::stringbuf::str();
    throw_logic_error(&sStack_58);
  }
  std::__cxx11::string::~string((string *)&sStack_58);
  return bVar1;
}

Assistant:

bool WildcardPattern::matches( std::string const& str ) const {
        switch( m_wildcard ) {
            case NoWildcard:
                return m_pattern == normaliseString( str );
            case WildcardAtStart:
                return endsWith( normaliseString( str ), m_pattern );
            case WildcardAtEnd:
                return startsWith( normaliseString( str ), m_pattern );
            case WildcardAtBothEnds:
                return contains( normaliseString( str ), m_pattern );
            default:
                CATCH_INTERNAL_ERROR( "Unknown enum" );
        }
    }